

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# axl_sys_Event.h
# Opt level: O1

__sighandler_t __thiscall
axl::sys::CondMutexEventBase<axl::sl::True>::signal
          (CondMutexEventBase<axl::sl::True> *this,int __sig,__sighandler_t __handler)

{
  Mutex *__mutex;
  bool bVar1;
  undefined7 extraout_var;
  undefined8 unaff_RBP;
  ulong uVar2;
  
  __mutex = &(this->m_condMutexPair).m_mutex;
  pthread_mutex_lock((pthread_mutex_t *)__mutex);
  uVar2 = CONCAT71((int7)((ulong)unaff_RBP >> 8),1);
  if (this->m_state == false) {
    this->m_state = true;
    bVar1 = psx::Cond::broadcast((Cond *)this);
    uVar2 = CONCAT71(extraout_var,bVar1) & 0xffffffff;
  }
  pthread_mutex_unlock((pthread_mutex_t *)__mutex);
  return (__sighandler_t)(uVar2 & 0xffffffff);
}

Assistant:

bool
	signal() {
		m_condMutexPair.lock();
		if (m_state) {
			m_condMutexPair.unlock();
			return true;
		}

		m_state = true;

		bool result = IsNotificationEvent()() ?
			m_condMutexPair.broadcast() :
			m_condMutexPair.signal();

		m_condMutexPair.unlock();
		return result;
	}